

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

void __thiscall
chrono::ChSystemDescriptor::SystemProduct
          (ChSystemDescriptor *this,ChVectorDynamic<> *result,ChVectorDynamic<> *x)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  pointer ppCVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  pointer ppCVar7;
  ChVariables *pCVar8;
  ChKblock *pCVar9;
  ChConstraint *pCVar10;
  int iVar11;
  long lVar12;
  CoeffReturnType pdVar13;
  Scalar *pSVar14;
  size_t ik;
  size_t ic_1;
  size_t iv;
  long lVar15;
  long index;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> local_88 [24];
  void *local_70;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_60 [24];
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_48 [24];
  
  iVar11 = (*this->_vptr_ChSystemDescriptor[7])();
  this->n_q = iVar11;
  iVar11 = (*this->_vptr_ChSystemDescriptor[8])(this);
  this->n_c = iVar11;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)iVar11 + (long)this->n_q);
  ppCVar4 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar5 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar6 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar7 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar12 = (long)(this->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
  for (lVar15 = 0; (long)ppCVar4 - (long)ppCVar6 >> 3 != lVar15; lVar15 = lVar15 + 1) {
    pCVar8 = (this->vvariables).
             super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar15];
    if (pCVar8->disabled == false) {
      Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
      Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
                (local_60,&result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (type *)0x0);
      Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
      Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
                (local_88,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x,(type *)0x0);
      (*pCVar8->_vptr_ChVariables[7])(this->c_a,pCVar8,local_60,local_88);
      Eigen::internal::handmade_aligned_free(local_70);
    }
  }
  for (lVar15 = 0; (long)ppCVar5 - (long)ppCVar7 >> 3 != lVar15; lVar15 = lVar15 + 1) {
    pCVar9 = (this->vstiffness).
             super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar15];
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              (local_48,&result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (type *)0x0);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              (local_88,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x,(type *)0x0);
    (*pCVar9->_vptr_ChKblock[4])(pCVar9,local_48,local_88);
    Eigen::internal::handmade_aligned_free(local_70);
  }
  for (lVar15 = 0; lVar12 != lVar15; lVar15 = lVar15 + 1) {
    pCVar10 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar15];
    if (pCVar10->active == true) {
      pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,
                           (long)this->n_q + (long)pCVar10->offset);
      (*pCVar10->_vptr_ChConstraint[10])(*pdVar13,pCVar10,result);
    }
  }
  for (lVar15 = 0; lVar12 != lVar15; lVar15 = lVar15 + 1) {
    pCVar10 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar15];
    if (pCVar10->active == true) {
      index = (long)this->n_q + (long)pCVar10->offset;
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)result,
                           index);
      (*pCVar10->_vptr_ChConstraint[9])(pCVar10,pSVar14,x);
      dVar1 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar15]->cfm_i;
      pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,index);
      dVar2 = *pdVar13;
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)result,
                           index);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar1;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar2;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *pSVar14;
      auVar3 = vfmadd213sd_fma(auVar17,auVar16,auVar3);
      *pSVar14 = auVar3._0_8_;
    }
  }
  return;
}

Assistant:

void ChSystemDescriptor::SystemProduct(ChVectorDynamic<>& result, const ChVectorDynamic<>& x) {
    n_q = CountActiveVariables();
    n_c = CountActiveConstraints();

    result.setZero(n_q + n_c);

    auto vv_size = vvariables.size();
    auto vc_size = vconstraints.size();
    auto vs_size = vstiffness.size();

    // 1) First row: result.q part =  [M + K]*x.q + [Cq']*x.l

    // 1.1)  do  M*x.q
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            vvariables[iv]->MultiplyAndAdd(result, x, c_a);
        }
    }

    // 1.2)  add also K*x.q  (NON straight parallelizable - risk of concurrency in writing)
    for (size_t ik = 0; ik < vs_size; ik++) {
        vstiffness[ik]->MultiplyAndAdd(result, x);
    }

    // 1.3)  add also [Cq]'*x.l  (NON straight parallelizable - risk of concurrency in writing)
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            vconstraints[ic]->MultiplyTandAdd(result, x(vconstraints[ic]->GetOffset() + n_q));
        }
    }

    // 2) Second row: result.l part =  [C_q]*x.q + [E]*x.l
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            int s_c = vconstraints[ic]->GetOffset() + n_q;
            vconstraints[ic]->MultiplyAndAdd(result(s_c), x);       // result.l_i += [C_q_i]*x.q
            result(s_c) += vconstraints[ic]->Get_cfm_i() * x(s_c);  // result.l_i += [E]*x.l_i
        }
    }
}